

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

void luaG_errormsg(lua_State *L)

{
  long lVar1;
  StkId pSVar2;
  StkId pSVar3;
  long lVar4;
  
  lVar1 = L->errfunc;
  if (lVar1 != 0) {
    pSVar2 = (L->top).p;
    pSVar3 = (L->stack).p;
    (pSVar2->val).value_ = pSVar2[-1].val.value_;
    (pSVar2->val).tt_ = *(lu_byte *)((long)pSVar2 + -8);
    lVar4 = (L->top).offset;
    *(undefined8 *)(lVar4 + -0x10) = *(undefined8 *)((long)pSVar3 + lVar1);
    *(undefined1 *)(lVar4 + -8) = *(undefined1 *)((long)pSVar3 + lVar1 + 8);
    lVar1 = (L->top).offset;
    (L->top).p = (StkId)(lVar1 + 0x10);
    luaD_callnoyield(L,(StkId)(lVar1 + -0x10),1);
  }
  luaD_throw(L,2);
}

Assistant:

l_noret luaG_errormsg (lua_State *L) {
  if (L->errfunc != 0) {  /* is there an error handling function? */
    StkId errfunc = restorestack(L, L->errfunc);
    lua_assert(ttisfunction(s2v(errfunc)));
    setobjs2s(L, L->top.p, L->top.p - 1);  /* move argument */
    setobjs2s(L, L->top.p - 1, errfunc);  /* push function */
    L->top.p++;  /* assume EXTRA_STACK */
    luaD_callnoyield(L, L->top.p - 2, 1);  /* call it */
  }
  luaD_throw(L, LUA_ERRRUN);
}